

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::ScaleRatioFromValueT<double,double,double>
                (ImGuiDataType data_type,double v,double v_min,double v_max,bool is_logarithmic,
                float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  float local_bc;
  double local_90;
  float local_84;
  double local_80;
  float local_74;
  double local_70;
  float zero_point_snap_R;
  float zero_point_snap_L;
  float zero_point_center;
  float result;
  double v_max_fudged;
  double v_min_fudged;
  bool flipped;
  double v_clamped;
  float zero_deadzone_halfsize_local;
  float logarithmic_zero_epsilon_local;
  bool is_logarithmic_local;
  double v_max_local;
  double v_min_local;
  double v_local;
  ImGuiDataType data_type_local;
  
  if ((v_min != v_max) || (NAN(v_min) || NAN(v_max))) {
    _logarithmic_zero_epsilon_local = v_max;
    v_max_local = v_min;
    v_min_local = v;
    v_local._0_4_ = data_type;
    if (v_max <= v_min) {
      local_70 = ImClamp<double>(v,v_max,v_min);
    }
    else {
      local_70 = ImClamp<double>(v,v_min,v_max);
    }
    if (is_logarithmic) {
      bVar1 = _logarithmic_zero_epsilon_local < v_max_local;
      if (bVar1) {
        ImSwap<double>(&v_max_local,(double *)&logarithmic_zero_epsilon_local);
      }
      dVar2 = ImAbs(v_max_local);
      if ((double)logarithmic_zero_epsilon <= dVar2) {
        local_80 = v_max_local;
      }
      else {
        local_74 = logarithmic_zero_epsilon;
        if (v_max_local < 0.0) {
          local_74 = -logarithmic_zero_epsilon;
        }
        local_80 = (double)local_74;
      }
      v_max_fudged = local_80;
      dVar2 = ImAbs(_logarithmic_zero_epsilon_local);
      if ((double)logarithmic_zero_epsilon <= dVar2) {
        local_90 = _logarithmic_zero_epsilon_local;
      }
      else {
        local_84 = logarithmic_zero_epsilon;
        if (_logarithmic_zero_epsilon_local < 0.0) {
          local_84 = -logarithmic_zero_epsilon;
        }
        local_90 = (double)local_84;
      }
      _zero_point_center = local_90;
      if (((v_max_local != 0.0) || (NAN(v_max_local))) || (0.0 <= _logarithmic_zero_epsilon_local))
      {
        if (((_logarithmic_zero_epsilon_local == 0.0) && (!NAN(_logarithmic_zero_epsilon_local))) &&
           (v_max_local < 0.0)) {
          _zero_point_center = (double)-logarithmic_zero_epsilon;
        }
      }
      else {
        v_max_fudged = (double)-logarithmic_zero_epsilon;
      }
      if (v_max_fudged < local_70) {
        if (local_70 < _zero_point_center) {
          if (0.0 <= v_max_local * _logarithmic_zero_epsilon_local) {
            if ((v_max_local < 0.0) || (_logarithmic_zero_epsilon_local < 0.0)) {
              dVar2 = ImLog(-local_70 / -_zero_point_center);
              dVar3 = ImLog(-v_max_fudged / -_zero_point_center);
              zero_point_snap_L = 1.0 - (float)(dVar2 / dVar3);
            }
            else {
              dVar2 = ImLog(local_70 / v_max_fudged);
              dVar3 = ImLog(_zero_point_center / v_max_fudged);
              zero_point_snap_L = (float)(dVar2 / dVar3);
            }
          }
          else {
            zero_point_snap_L =
                 -(float)v_max_local / ((float)_logarithmic_zero_epsilon_local - (float)v_max_local)
            ;
            if ((v_min_local != 0.0) || (NAN(v_min_local))) {
              if (0.0 <= v_min_local) {
                dVar2 = ImLog(local_70 / (double)logarithmic_zero_epsilon);
                dVar3 = ImLog(_zero_point_center / (double)logarithmic_zero_epsilon);
                zero_point_snap_L =
                     (float)(dVar2 / dVar3) * (1.0 - (zero_point_snap_L + zero_deadzone_halfsize)) +
                     zero_point_snap_L + zero_deadzone_halfsize;
              }
              else {
                dVar2 = ImLog(-local_70 / (double)logarithmic_zero_epsilon);
                dVar3 = ImLog(-v_max_fudged / (double)logarithmic_zero_epsilon);
                zero_point_snap_L =
                     (1.0 - (float)(dVar2 / dVar3)) * (zero_point_snap_L - zero_deadzone_halfsize);
              }
            }
          }
        }
        else {
          zero_point_snap_L = 1.0;
        }
      }
      else {
        zero_point_snap_L = 0.0;
      }
      if (bVar1) {
        local_bc = 1.0 - zero_point_snap_L;
      }
      else {
        local_bc = zero_point_snap_L;
      }
      v_local._4_4_ = local_bc;
    }
    else {
      v_local._4_4_ =
           (float)((local_70 - v_max_local) / (_logarithmic_zero_epsilon_local - v_max_local));
    }
  }
  else {
    v_local._4_4_ = 0.0;
  }
  return v_local._4_4_;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}